

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O1

size_t __thiscall leveldb::RecoveryTest::DeleteLogFiles(RecoveryTest *this)

{
  Env *pEVar1;
  Tester *this_00;
  size_t sVar2;
  ulong uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  Status local_230;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  string local_210;
  string local_1f0;
  Tester local_1d0;
  
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  this->db_ = (DB *)0x0;
  GetFiles(&local_228,this,kLogFile);
  if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      local_1d0.ok_ = true;
      local_1d0.fname_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
      ;
      local_1d0.line_ = 0x67;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
      pEVar1 = this->env_;
      LogFileName(&local_1f0,&this->dbname_,
                  local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar3]);
      (*pEVar1->_vptr_Env[8])(&local_230,pEVar1,&local_1f0);
      this_00 = test::Tester::IsOk(&local_1d0,&local_230);
      LogFileName(&local_210,&this->dbname_,
                  local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar3]);
      test::Tester::operator<<(this_00,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if (local_230.state_ != (char *)0x0) {
        operator_delete__(local_230.state_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      test::Tester::~Tester(&local_1d0);
      uVar3 = uVar3 + 1;
      sVar2 = (long)local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
    } while (uVar3 < sVar2);
  }
  if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return sVar2;
}

Assistant:

size_t DeleteLogFiles() {
    // Linux allows unlinking open files, but Windows does not.
    // Closing the db allows for file deletion.
    Close();
    std::vector<uint64_t> logs = GetFiles(kLogFile);
    for (size_t i = 0; i < logs.size(); i++) {
      ASSERT_OK(env_->DeleteFile(LogName(logs[i]))) << LogName(logs[i]);
    }
    return logs.size();
  }